

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

int rw::strcmp_ci(char *s1,char *s2)

{
  char cVar1;
  int iVar2;
  char c2;
  char *pcStack_20;
  char c1;
  char *s2_local;
  char *s1_local;
  
  pcStack_20 = s2;
  s2_local = s1;
  while( true ) {
    iVar2 = tolower((int)*s2_local);
    cVar1 = (char)iVar2;
    iVar2 = tolower((int)*pcStack_20);
    if (cVar1 != (char)iVar2) {
      return (int)cVar1 - (int)(char)iVar2;
    }
    if (cVar1 == '\0') break;
    s2_local = s2_local + 1;
    pcStack_20 = pcStack_20 + 1;
  }
  return 0;
}

Assistant:

int
strcmp_ci(const char *s1, const char *s2)
{
	char c1, c2;
	for(;;){
		c1 = tolower(*s1);
		c2 = tolower(*s2);
		if(c1 != c2)
			return c1 - c2;
		if(c1 == '\0')
			return 0;
		s1++;
		s2++;
	}
}